

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslTokenStream.h
# Opt level: O0

void __thiscall
glslang::HlslTokenStream::HlslTokenStream(HlslTokenStream *this,HlslScanContext *scanner)

{
  HlslToken *local_40;
  HlslToken *local_20;
  HlslScanContext *scanner_local;
  HlslTokenStream *this_local;
  
  this->_vptr_HlslTokenStream = (_func_int **)&PTR__HlslTokenStream_013aa890;
  HlslToken::HlslToken(&this->token);
  this->scanner = scanner;
  TVector<const_glslang::TVector<glslang::HlslToken>_*>::TVector(&this->tokenStreamStack);
  TVector<int>::TVector(&this->tokenPosition);
  TVector<glslang::HlslToken>::TVector(&this->currentTokenStack);
  local_20 = this->preTokenStack;
  do {
    HlslToken::HlslToken(local_20);
    local_20 = local_20 + 1;
  } while (local_20 != (HlslToken *)&this->preTokenStackSize);
  this->preTokenStackSize = 0;
  local_40 = this->tokenBuffer;
  do {
    HlslToken::HlslToken(local_40);
    local_40 = local_40 + 1;
  } while (local_40 != (HlslToken *)&this->tokenBufferPos);
  this->tokenBufferPos = 0;
  return;
}

Assistant:

explicit HlslTokenStream(HlslScanContext& scanner)
            : scanner(scanner), preTokenStackSize(0), tokenBufferPos(0) { }